

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_io_components_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::EliminateDeadIOComponentsPass::ChangeArrayLength
          (EliminateDeadIOComponentsPass *this,Instruction *arr_var,uint length)

{
  uint32_t uVar1;
  int iVar2;
  TypeManager *this_00;
  ConstantManager *this_01;
  DefUseManager *this_02;
  Type *pTVar3;
  undefined4 extraout_var;
  Array *this_03;
  Pointer new_ptr_ty;
  Array new_arr_ty;
  Pointer local_b8;
  Array local_80;
  
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  this_01 = IRContext::get_constant_mgr((this->super_Pass).context_);
  this_02 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  uVar1 = Instruction::type_id(arr_var);
  pTVar3 = analysis::TypeManager::GetType(this_00,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[0x1f])(pTVar3);
  this_03 = (Array *)(**(code **)(**(long **)(CONCAT44(extraout_var,iVar2) + 0x28) + 0xc0))();
  if (this_03 != (Array *)0x0) {
    uVar1 = analysis::ConstantManager::GetUIntConstId(this_01,length);
    pTVar3 = this_03->element_type_;
    analysis::Array::GetConstantLengthInfo((LengthInfo *)&local_b8,this_03,uVar1,length);
    analysis::Array::Array(&local_80,pTVar3,(LengthInfo *)&local_b8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
               &local_b8.super_Type.decorations_);
    pTVar3 = analysis::TypeManager::GetRegisteredType(this_00,&local_80.super_Type);
    analysis::Pointer::Pointer
              (&local_b8,pTVar3,*(StorageClass *)(CONCAT44(extraout_var,iVar2) + 0x30));
    pTVar3 = analysis::TypeManager::GetRegisteredType(this_00,&local_b8.super_Type);
    uVar1 = analysis::TypeManager::GetTypeInstruction(this_00,pTVar3);
    Instruction::SetResultType(arr_var,uVar1);
    analysis::DefUseManager::AnalyzeInstUse(this_02,arr_var);
    analysis::Type::~Type(&local_b8.super_Type);
    analysis::Array::~Array(&local_80);
    return;
  }
  __assert_fail("arr_ty && \"expecting array type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp"
                ,0xc5,
                "void spvtools::opt::EliminateDeadIOComponentsPass::ChangeArrayLength(Instruction &, unsigned int)"
               );
}

Assistant:

void EliminateDeadIOComponentsPass::ChangeArrayLength(Instruction& arr_var,
                                                      unsigned length) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::Pointer* ptr_type =
      type_mgr->GetType(arr_var.type_id())->AsPointer();
  const analysis::Array* arr_ty = ptr_type->pointee_type()->AsArray();
  assert(arr_ty && "expecting array type");
  uint32_t length_id = const_mgr->GetUIntConstId(length);
  analysis::Array new_arr_ty(arr_ty->element_type(),
                             arr_ty->GetConstantLengthInfo(length_id, length));
  analysis::Type* reg_new_arr_ty = type_mgr->GetRegisteredType(&new_arr_ty);
  analysis::Pointer new_ptr_ty(reg_new_arr_ty, ptr_type->storage_class());
  analysis::Type* reg_new_ptr_ty = type_mgr->GetRegisteredType(&new_ptr_ty);
  uint32_t new_ptr_ty_id = type_mgr->GetTypeInstruction(reg_new_ptr_ty);
  arr_var.SetResultType(new_ptr_ty_id);
  def_use_mgr->AnalyzeInstUse(&arr_var);
}